

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O3

void __thiscall
CorUnix::CSharedMemoryFileTransactionLock::ReleaseLock(CSharedMemoryFileTransactionLock *this)

{
  FILEUnlockFileRegion
            (this->m_shmFileLocks,this->m_pvControllerInstance,this->m_lockRgnStart,
             this->m_nbBytesToLock,RDWR_LOCK_RGN);
  (*(this->super_IFileTransactionLock)._vptr_IFileTransactionLock[1])(this);
  InternalFree(this);
  return;
}

Assistant:

void
CSharedMemoryFileTransactionLock::ReleaseLock()
{
    FILEUnlockFileRegion(
        m_shmFileLocks,
        m_pvControllerInstance,
        m_lockRgnStart, 
        m_nbBytesToLock,
        RDWR_LOCK_RGN
        );

    InternalDelete(this);
}